

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_pubkey_load(secp256k1_context *ctx,secp256k1_ge *ge,secp256k1_pubkey *pubkey)

{
  int iVar1;
  void *in_RDX;
  secp256k1_ge_storage s;
  secp256k1_ge_storage *in_stack_ffffffffffffff98;
  secp256k1_ge *in_stack_ffffffffffffffa0;
  uint local_4;
  
  memcpy(&stack0xffffffffffffffa0,in_RDX,0x40);
  secp256k1_ge_from_storage(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  iVar1 = secp256k1_fe_is_zero((secp256k1_fe *)0x102580);
  if (iVar1 != 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  }
  local_4 = (uint)(iVar1 == 0);
  return local_4;
}

Assistant:

static int secp256k1_pubkey_load(const secp256k1_context* ctx, secp256k1_ge* ge, const secp256k1_pubkey* pubkey) {
    if (sizeof(secp256k1_ge_storage) == 64) {
        /* When the secp256k1_ge_storage type is exactly 64 byte, use its
         * representation inside secp256k1_pubkey, as conversion is very fast.
         * Note that secp256k1_pubkey_save must use the same representation. */
        secp256k1_ge_storage s;
        memcpy(&s, &pubkey->data[0], sizeof(s));
        secp256k1_ge_from_storage(ge, &s);
    } else {
        /* Otherwise, fall back to 32-byte big endian for X and Y. */
        secp256k1_fe x, y;
        ARG_CHECK(secp256k1_fe_set_b32_limit(&x, pubkey->data));
        ARG_CHECK(secp256k1_fe_set_b32_limit(&y, pubkey->data + 32));
        secp256k1_ge_set_xy(ge, &x, &y);
    }
    ARG_CHECK(!secp256k1_fe_is_zero(&ge->x));
    return 1;
}